

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

string * __thiscall
wabt::interp::Thread::TraceSource::Pick_abi_cxx11_
          (string *__return_storage_ptr__,TraceSource *this,Index index,Instr instr)

{
  Enum EVar1;
  Value *pVVar2;
  Type TVar3;
  ValueType VVar4;
  long lVar5;
  pointer pGVar6;
  char *pcVar7;
  uint n;
  int iVar8;
  double dVar9;
  allocator<char> local_51;
  ulong local_50;
  ulong local_48;
  TraceSource *local_40;
  ulong local_38;
  
  local_40 = this;
  pVVar2 = Thread::Pick(this->thread_,index);
  local_50 = (ulong)(pVVar2->field_0).i32_;
  local_48 = (ulong)*(uint *)((long)&pVVar2->field_0 + 4);
  local_38 = *(ulong *)((long)&pVVar2->field_0 + 8);
  iVar8 = index - 4;
  n = 3;
  while ((n != 0 && (TVar3 = Opcode::GetParamType(&instr.op,n), TVar3.enum_ == Void))) {
    iVar8 = iVar8 + 1;
    n = n - 1;
  }
  if (n < index) {
LAB_0019f11c:
    if ((instr.op.enum_ - TableSet < 4) && (instr.op.enum_ - TableSet != 2)) {
      pGVar6 = (pointer)(local_40->thread_->mod_->desc_).tables.
                        super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (ulong)instr.field_2.imm_u32 * 0x30;
    }
    else {
      if (instr.op.enum_ - LocalSet < 2) {
        VVar4 = GetLocalType(local_40,instr.field_2.imm_u32);
        EVar1 = VVar4.enum_;
        goto LAB_0019f18e;
      }
      if (instr.op.enum_ != GlobalSet) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"?",&local_51);
        return __return_storage_ptr__;
      }
      pGVar6 = (local_40->thread_->mod_->desc_).globals.
               super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (ulong)instr.field_2.imm_u32 * 0x90;
    }
    EVar1 = *(Enum *)((long)&(((TableType *)&pGVar6->type)->super_ExternType).field_0xc + lVar5);
  }
  else {
    TVar3 = Opcode::GetParamType(&instr.op,-iVar8);
    EVar1 = TVar3.enum_;
    if (EVar1 == Void) goto LAB_0019f11c;
  }
LAB_0019f18e:
  switch(EVar1) {
  case ExternRef:
    pcVar7 = "externref";
    goto LAB_0019f1d4;
  case FuncRef:
    pcVar7 = "funcref";
    goto LAB_0019f1d4;
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
  case I16:
  case I8:
switchD_0019f1a4_caseD_fffffff1:
    abort();
  case V128:
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"0x%08x 0x%08x 0x%08x 0x%08x",local_50,local_48,local_38,
               local_38 >> 0x20);
    break;
  case F64:
    dVar9 = (double)((local_48 << 0x20) + local_50);
    goto LAB_0019f20b;
  case F32:
    dVar9 = (double)(float)local_50;
LAB_0019f20b:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g",dVar9);
    break;
  case I64:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%lu",(local_48 << 0x20) + local_50);
    break;
  case I32:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%u",local_50);
    break;
  default:
    if (EVar1 != ExnRef) goto switchD_0019f1a4_caseD_fffffff1;
    pcVar7 = "exnref";
LAB_0019f1d4:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:%zd",pcVar7,(local_48 << 0x20) + local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Thread::TraceSource::Pick(Index index, Instr instr) {
  Value val = thread_->Pick(index);
  const char* reftype;
  // Estimate number of operands.
  // TODO: Instead, record this accurately in opcode.def.
  Index num_operands = 3;
  for (Index i = 3; i >= 1; i--) {
    if (instr.op.GetParamType(i) == ValueType::Void) {
      num_operands--;
    } else {
      break;
    }
  }
  auto type = index > num_operands
                  ? Type(ValueType::Void)
                  : instr.op.GetParamType(num_operands - index + 1);
  if (type == ValueType::Void) {
    // Void should never be displayed normally; we only expect to see it when
    // the stack may have different a different type. This is likely to occur
    // with an index; try to see which type we should expect.
    switch (instr.op) {
      case Opcode::GlobalSet: type = GetGlobalType(instr.imm_u32); break;
      case Opcode::LocalSet:
      case Opcode::LocalTee:  type = GetLocalType(instr.imm_u32); break;
      case Opcode::TableSet:
      case Opcode::TableGrow:
      case Opcode::TableFill: type = GetTableElementType(instr.imm_u32); break;
      default: return "?";
    }
  }

  switch (type) {
    case ValueType::I32: return StringPrintf("%u", val.Get<u32>());
    case ValueType::I64: return StringPrintf("%" PRIu64, val.Get<u64>());
    case ValueType::F32: return StringPrintf("%g", val.Get<f32>());
    case ValueType::F64: return StringPrintf("%g", val.Get<f64>());
    case ValueType::V128: {
      auto v = val.Get<v128>();
      return StringPrintf("0x%08x 0x%08x 0x%08x 0x%08x", v.u32(0), v.u32(1),
                          v.u32(2), v.u32(3));
    }

      // clang-format off
    case ValueType::FuncRef:    reftype = "funcref"; break;
    case ValueType::ExternRef:  reftype = "externref"; break;
    case ValueType::ExnRef:     reftype = "exnref"; break;
      // clang-format on

    default:
      WABT_UNREACHABLE;
      break;
  }

  // Handle ref types.
  return StringPrintf("%s:%" PRIzd, reftype, val.Get<Ref>().index);
}